

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsInput helicsFederateGetInput(HelicsFederate fed,char *key,HelicsError *err)

{
  bool bVar1;
  element_type *this;
  HelicsError *in_RDX;
  long in_RSI;
  string_view in_stack_00000000;
  Input *in_stack_00000030;
  Input *input;
  shared_ptr<helics::ValueFederate> fedObj;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  HelicsError *in_stack_ffffffffffffff90;
  HelicsFederate in_stack_ffffffffffffff98;
  __shared_ptr local_30 [16];
  HelicsError *local_20;
  long local_18;
  ValueFederate *in_stack_fffffffffffffff8;
  HelicsInput pvVar2;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  getValueFedSharedPtr(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
  if (bVar1) {
    if (local_18 == 0) {
      assignError(local_20,-4,"The supplied string argument is null and therefore invalid");
      pvVar2 = (HelicsInput)0x0;
    }
    else {
      this = std::
             __shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cdbe7);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                 (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      helics::ValueFederate::getInput(in_stack_fffffffffffffff8,in_stack_00000000);
      bVar1 = helics::Interface::isValid((Interface *)0x1cdc2a);
      if (bVar1) {
        pvVar2 = anon_unknown.dwarf_5d1c2::findOrCreateInput(input,in_stack_00000030);
      }
      else {
        assignError(local_20,-4,"the specified input name is a not a recognized input");
        pvVar2 = (HelicsInput)0x0;
      }
    }
  }
  else {
    pvVar2 = (HelicsInput)0x0;
  }
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1cdcde)
  ;
  return pvVar2;
}

Assistant:

HelicsInput helicsFederateGetInput(HelicsFederate fed, const char* key, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(key, nullptr);
    try {
        auto& input = fedObj->getInput(key);
        if (!input.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidInputName);
            return nullptr;
        }
        return findOrCreateInput(fed, input);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}